

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::X
          (TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *this,TPZVec<Fad<double>_> *coordinate,
          TPZVec<Fad<double>_> *result)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *in_stack_fffffffffffffda0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff88;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff90;
  TPZFMatrix<double> *in_stack_ffffffffffffff98;
  TPZTriangleTorus *in_stack_ffffffffffffffa0;
  
  (**(code **)(*in_RDX + 0x18))();
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZTriangleTorus::X<Fad<double>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x172a72c);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<Fad<REAL> > &coordinate,TPZVec<Fad<REAL> > &result) const {
    result.Resize(3);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.X(cornerco,coordinate,result);
}